

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtprawpacket.h
# Opt level: O2

void __thiscall jrtplib::RTPRawPacket::DeleteData(RTPRawPacket *this)

{
  RTPMemoryManager *in_RDX;
  
  if ((jrtplib *)this->packetdata != (jrtplib *)0x0) {
    RTPDeleteByteArray((jrtplib *)this->packetdata,(uint8_t *)(this->super_RTPMemoryObject).mgr,
                       in_RDX);
  }
  if (this->senderaddress != (RTPAddress *)0x0) {
    RTPDelete<jrtplib::RTPAddress>(this->senderaddress,(this->super_RTPMemoryObject).mgr);
  }
  this->packetdata = (uint8_t *)0x0;
  this->senderaddress = (RTPAddress *)0x0;
  return;
}

Assistant:

inline void RTPRawPacket::DeleteData()
{
	if (packetdata)
		RTPDeleteByteArray(packetdata,GetMemoryManager());
	if (senderaddress)
		RTPDelete(senderaddress,GetMemoryManager());

	packetdata = 0;
	senderaddress = 0;
}